

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O0

uint __thiscall JPG::getVerticalSamplingFrequency(JPG *this,uint ID)

{
  runtime_error *this_00;
  uint ID_local;
  JPG *this_local;
  
  if (ID == 1) {
    this_local._4_4_ = (uint)this->YVerticalSamplingFrequency;
  }
  else if (ID == 2) {
    this_local._4_4_ = (uint)this->CbVerticalSamplingFrequency;
  }
  else {
    if (ID != 3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Error - Block ID not existed:" + ID);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._4_4_ = (uint)this->CrVerticalSamplingFrequency;
  }
  return this_local._4_4_;
}

Assistant:

uint getVerticalSamplingFrequency(uint ID) const{
        if(ID == 1) {
            return YVerticalSamplingFrequency;
        } else if(ID == 2) {
          return CbVerticalSamplingFrequency;  
        } else if(ID == 3) {
            return CrVerticalSamplingFrequency;
        } else 
            throw std::runtime_error("Error - Block ID not existed:" + ID);
    }